

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_pluginlist.cpp
# Opt level: O1

bool __thiscall ON_PlugInRef::Read(ON_PlugInRef *this,ON_BinaryArchive *file)

{
  bool bVar1;
  bool bVar2;
  int minor_version;
  int major_version;
  int local_20;
  int local_1c;
  
  Default(this);
  local_1c = 0;
  local_20 = 0;
  bVar1 = ON_BinaryArchive::BeginRead3dmChunk(file,0x40008000,&local_1c,&local_20);
  if (bVar1) {
    bVar2 = false;
    if ((local_1c == 1) && (bVar2 = false, -1 < local_20)) {
      bVar2 = ON_BinaryArchive::ReadUuid(file,&this->m_plugin_id);
      if (bVar2) {
        bVar2 = ON_BinaryArchive::ReadInt(file,&this->m_plugin_type);
      }
      if (bVar2 != false) {
        bVar2 = ON_BinaryArchive::ReadString(file,&this->m_plugin_name);
      }
      if (bVar2 != false) {
        bVar2 = ON_BinaryArchive::ReadString(file,&this->m_plugin_version);
      }
      if (bVar2 != false) {
        bVar2 = ON_BinaryArchive::ReadString(file,&this->m_plugin_filename);
      }
      if (0 < local_20) {
        if (bVar2 != false) {
          bVar2 = ON_BinaryArchive::ReadString(file,&this->m_developer_organization);
        }
        if (bVar2 != false) {
          bVar2 = ON_BinaryArchive::ReadString(file,&this->m_developer_address);
        }
        if (bVar2 != false) {
          bVar2 = ON_BinaryArchive::ReadString(file,&this->m_developer_country);
        }
        if (bVar2 != false) {
          bVar2 = ON_BinaryArchive::ReadString(file,&this->m_developer_phone);
        }
        if (bVar2 != false) {
          bVar2 = ON_BinaryArchive::ReadString(file,&this->m_developer_email);
        }
        if (bVar2 != false) {
          bVar2 = ON_BinaryArchive::ReadString(file,&this->m_developer_website);
        }
        if (bVar2 != false) {
          bVar2 = ON_BinaryArchive::ReadString(file,&this->m_developer_updateurl);
        }
        if (bVar2 != false) {
          bVar2 = ON_BinaryArchive::ReadString(file,&this->m_developer_fax);
        }
        if (1 < local_20) {
          if (bVar2 != false) {
            bVar2 = ON_BinaryArchive::ReadInt(file,&this->m_plugin_platform);
          }
          if (bVar2 != false) {
            bVar2 = ON_BinaryArchive::ReadInt(file,&this->m_plugin_sdk_version);
          }
          if (bVar2 != false) {
            bVar2 = ON_BinaryArchive::ReadInt(file,&this->m_plugin_sdk_service_release);
          }
        }
      }
    }
    bVar1 = ON_BinaryArchive::EndRead3dmChunk(file);
    bVar1 = (bool)(bVar1 & bVar2);
  }
  return bVar1;
}

Assistant:

bool ON_PlugInRef::Read( ON_BinaryArchive& file )
{
  Default();

  int major_version = 0;
  int minor_version = 0;

  bool rc = file.BeginRead3dmChunk(
                  TCODE_ANONYMOUS_CHUNK,
                  &major_version,
                  &minor_version);

  if (rc)
  {
    if( 1 == major_version && minor_version >= 0 )
    {
      //version 1.0 fields
      if (rc) rc = file.ReadUuid(m_plugin_id);
      if (rc) rc = file.ReadInt(&m_plugin_type);
      if (rc) rc = file.ReadString(m_plugin_name);
      if (rc) rc = file.ReadString(m_plugin_version);
      if (rc) rc = file.ReadString(m_plugin_filename);

      if ( minor_version >= 1)
      {
        // version 1.1 fields
        if (rc) rc = file.ReadString(m_developer_organization);
        if (rc) rc = file.ReadString(m_developer_address);
        if (rc) rc = file.ReadString(m_developer_country);
        if (rc) rc = file.ReadString(m_developer_phone);
        if (rc) rc = file.ReadString(m_developer_email);
        if (rc) rc = file.ReadString(m_developer_website);
        if (rc) rc = file.ReadString(m_developer_updateurl);
        if (rc) rc = file.ReadString(m_developer_fax);

        if ( minor_version >= 2 )
        {
          if (rc) rc = file.ReadInt(&m_plugin_platform);
          if (rc) rc = file.ReadInt(&m_plugin_sdk_version);
          if (rc) rc = file.ReadInt(&m_plugin_sdk_service_release);
        }
      }
    }
    else
    {
      rc = false;
    }

    if( !file.EndRead3dmChunk() )
      rc = false;
  }
  return rc;
}